

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_zip.c
# Opt level: O0

void verify_extract_length_at_end(archive *a,int seek_checks)

{
  wchar_t in_ESI;
  archive_entry *in_RDI;
  wchar_t unaff_retaddr;
  char *in_stack_00000008;
  archive_entry *ae;
  undefined4 in_stack_00000018;
  wchar_t in_stack_00000028;
  undefined4 in_stack_0000002c;
  wchar_t in_stack_00000034;
  char *in_stack_00000038;
  archive_entry **in_stack_ffffffffffffffd8;
  void *pvVar1;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar2;
  uint in_stack_ffffffffffffffe4;
  wchar_t in_stack_ffffffffffffffe8;
  wchar_t in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  archive_entry *_a;
  
  archive_read_next_header
            ((archive *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffd8);
  assertion_equal_int((char *)in_RDI,in_ESI,
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                      (longlong)in_RDI,(char *)0x1ba69b,ae);
  archive_entry_is_encrypted
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  assertion_equal_int((char *)in_RDI,in_ESI,
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),0,
                      (char *)0x1ba6d4,ae);
  archive_read_has_encrypted_entries
            ((archive *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  _a = in_RDI;
  assertion_equal_int((char *)in_RDI,in_ESI,
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                      (longlong)in_RDI,(char *)0x1ba70c,ae);
  archive_entry_pathname(in_RDI);
  pvVar1 = (void *)0x0;
  uVar2 = 0;
  assertion_equal_string
            (in_stack_00000008,unaff_retaddr,(char *)_a,
             (char *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
             (char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
             (char *)((ulong)in_stack_ffffffffffffffe4 << 0x20),a,in_stack_00000028);
  if (in_ESI == L'\0') {
    archive_entry_size_is_set
              ((archive_entry *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    assertion_assert((char *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec,
                     in_stack_ffffffffffffffe8,(char *)CONCAT44(in_stack_ffffffffffffffe4,uVar2),
                     pvVar1);
    archive_entry_size((archive_entry *)
                       CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    assertion_equal_int((char *)_a,in_ESI,
                        CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                        (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar2),0,(char *)0x1ba86d,ae);
  }
  else {
    archive_entry_mode((archive_entry *)
                       CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    pvVar1 = (void *)0x0;
    assertion_equal_int((char *)_a,in_ESI,
                        CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                        (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar2),0,(char *)0x1ba79b,ae);
    archive_entry_size_is_set
              ((archive_entry *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    assertion_assert((char *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec,
                     in_stack_ffffffffffffffe8,(char *)CONCAT44(in_stack_ffffffffffffffe4,uVar2),
                     pvVar1);
    archive_entry_size((archive_entry *)
                       CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    assertion_equal_int((char *)_a,in_ESI,
                        CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                        (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar2),0,(char *)0x1ba7ff,ae);
  }
  archive_read_extract
            ((archive *)_a,(archive_entry *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
             in_stack_ffffffffffffffec);
  assertion_equal_int((char *)_a,in_ESI,
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar2),(longlong)_a,
                      (char *)0x1ba8ad,ae);
  assertion_file_contents
            (in_stack_00000038,in_stack_00000034,
             (void *)CONCAT44(in_stack_0000002c,in_stack_00000028),a._4_4_,
             (char *)CONCAT44(seek_checks,in_stack_00000018));
  archive_read_close((archive *)0x1ba8db);
  assertion_equal_int((char *)_a,in_ESI,
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar2),(longlong)_a,
                      (char *)0x1ba90a,ae);
  archive_read_free((archive *)0x1ba914);
  assertion_equal_int((char *)_a,in_ESI,
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar2),(longlong)_a,
                      (char *)0x1ba943,ae);
  return;
}

Assistant:

static void
verify_extract_length_at_end(struct archive *a, int seek_checks)
{
	struct archive_entry *ae;

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));

	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), 0);
	assertEqualString("hello.txt", archive_entry_pathname(ae));
	if (seek_checks) {
		assertEqualInt(AE_IFREG | 0644, archive_entry_mode(ae));
		assert(archive_entry_size_is_set(ae));
		assertEqualInt(6, archive_entry_size(ae));
	} else {
		assert(!archive_entry_size_is_set(ae));
		assertEqualInt(0, archive_entry_size(ae));
	}

	if (libz_enabled) {
		assertEqualIntA(a, ARCHIVE_OK, archive_read_extract(a, ae, 0));
		assertFileContents("hello\x0A", 6, "hello.txt");
	} else {
		assertEqualIntA(a, ARCHIVE_FAILED, archive_read_extract(a, ae, 0));
		assertEqualString(archive_error_string(a),
		    "Unsupported ZIP compression method (deflation)");
		assert(archive_errno(a) != 0);
	}

	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_free(a));
}